

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeLiteGenerator::FindMatchingHeaderfiles
          (cmExtraCodeLiteGenerator *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
          *cFiles,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *otherFiles)

{
  cmake *pcVar1;
  pointer pbVar2;
  bool bVar3;
  iterator iVar4;
  _Rb_tree_node_base *p_Var5;
  pointer args;
  string hname;
  string headerBasename;
  cmAlphaNum local_f0;
  string local_c0;
  string local_a0;
  cmAlphaNum local_80;
  string local_50;
  
  pcVar1 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
  p_Var5 = (cFiles->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var5 == &(cFiles->_M_t)._M_impl.super__Rb_tree_header) {
      return;
    }
    cmsys::SystemTools::GetFilenamePath(&local_c0,(string *)(p_Var5 + 1));
    local_80.View_._M_len = local_c0._M_string_length;
    local_80.View_._M_str = local_c0._M_dataplus._M_p;
    local_f0.View_._M_len = 1;
    local_f0.View_._M_str = local_f0.Digits_;
    local_f0.Digits_[0] = '/';
    cmsys::SystemTools::GetFilenameWithoutExtension(&local_50,(string *)(p_Var5 + 1));
    cmStrCat<std::__cxx11::string>(&local_a0,&local_80,&local_f0,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_c0);
    pbVar2 = (pcVar1->HeaderFileExtensions).ordered.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (args = (pcVar1->HeaderFileExtensions).ordered.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; args != pbVar2; args = args + 1) {
      local_80.View_._M_len = local_a0._M_string_length;
      local_80.View_._M_str = local_a0._M_dataplus._M_p;
      local_f0.View_._M_len = 1;
      local_f0.View_._M_str = local_f0.Digits_;
      local_f0.Digits_[0] = '.';
      cmStrCat<std::__cxx11::string>(&local_c0,&local_80,&local_f0,args);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&otherFiles->_M_t,&local_c0);
      if ((_Rb_tree_header *)iVar4._M_node != &(otherFiles->_M_t)._M_impl.super__Rb_tree_header) {
LAB_00348ca1:
        std::__cxx11::string::~string((string *)&local_c0);
        break;
      }
      bVar3 = cmsys::SystemTools::FileExists(&local_c0);
      if (bVar3) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)otherFiles,&local_c0);
        goto LAB_00348ca1;
      }
      std::__cxx11::string::~string((string *)&local_c0);
    }
    std::__cxx11::string::~string((string *)&local_a0);
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

void cmExtraCodeLiteGenerator::FindMatchingHeaderfiles(
  std::map<std::string, cmSourceFile*>& cFiles,
  std::set<std::string>& otherFiles)
{

  const std::vector<std::string>& headerExts =
    this->GlobalGenerator->GetCMakeInstance()->GetHeaderExtensions();

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the CodeBlocks
  // project generator.
  for (auto const& sit : cFiles) {
    std::string headerBasename =
      cmStrCat(cmSystemTools::GetFilenamePath(sit.first), '/',
               cmSystemTools::GetFilenameWithoutExtension(sit.first));

    // check if there's a matching header around
    for (std::string const& ext : headerExts) {
      std::string hname = cmStrCat(headerBasename, '.', ext);
      // if it's already in the set, don't check if it exists on disk
      auto headerIt = otherFiles.find(hname);
      if (headerIt != otherFiles.end()) {
        break;
      }

      if (cmSystemTools::FileExists(hname)) {
        otherFiles.insert(hname);
        break;
      }
    }
  }
}